

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpdatableModelValidatorTests.cpp
# Opt level: O2

int testInvalid_Classifier_OnlyTarget(void)

{
  Rep *pRVar1;
  bool bVar2;
  ModelDescription *pMVar3;
  FeatureDescription *pFVar4;
  NeuralNetworkClassifier *pNVar5;
  Type *this;
  CategoricalCrossEntropyLossLayer *pCVar6;
  FeatureType *this_00;
  ArrayFeatureType *this_01;
  ostream *poVar7;
  long lVar8;
  int iVar9;
  char *pcVar10;
  NetworkUpdateParameters *pNVar11;
  void **ppvVar12;
  allocator local_1c9;
  Model spec;
  FeatureDescription feature;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  classLabels;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_150;
  string target;
  _Vector_base<long,_std::allocator<long>_> local_118;
  TensorAttributes tensorAttributesIn;
  Result res;
  string labels [4];
  
  CoreML::Specification::Model::Model(&spec);
  CoreML::Result::Result(&res);
  tensorAttributesIn.name = "InTensor";
  tensorAttributesIn.dimension = 3;
  tensorAttributesIn._12_4_ = 0;
  std::__cxx11::string::string((string *)labels,"1",(allocator *)&feature);
  std::__cxx11::string::string((string *)(labels + 1),"2",(allocator *)&target);
  std::__cxx11::string::string((string *)(labels + 2),"3",(allocator *)&classLabels);
  std::__cxx11::string::string((string *)(labels + 3),"4",&local_1c9);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  vector<std::__cxx11::string*,void>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&classLabels,
             labels,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    &stack0xffffffffffffffc8,(allocator_type *)&feature);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_150,&classLabels);
  local_118._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_118._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_118._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  buildBasicNeuralNetworkClassifierModel
            (&spec,true,&tensorAttributesIn,&local_150,
             (vector<long,_std::allocator<long>_> *)&local_118,true);
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base(&local_118);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_150);
  spec.specificationversion_ = 4;
  pMVar3 = CoreML::Specification::Model::mutable_description(&spec);
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
            (&(pMVar3->traininginput_).super_RepeatedPtrFieldBase);
  pMVar3 = CoreML::Specification::Model::mutable_description(&spec);
  pFVar4 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar3->traininginput_);
  pNVar5 = CoreML::Specification::Model::neuralnetworkclassifier(&spec);
  pNVar11 = pNVar5->updateparams_;
  if (pNVar11 == (NetworkUpdateParameters *)0x0) {
    pNVar11 = (NetworkUpdateParameters *)
              &CoreML::Specification::_NetworkUpdateParameters_default_instance_;
  }
  this = google::protobuf::internal::RepeatedPtrFieldBase::
         Get<google::protobuf::RepeatedPtrField<CoreML::Specification::LossLayer>::TypeHandler>
                   (&(pNVar11->losslayers_).super_RepeatedPtrFieldBase,0);
  pCVar6 = CoreML::Specification::LossLayer::categoricalcrossentropylosslayer(this);
  std::__cxx11::string::string((string *)&target,(string *)(pCVar6->target_).ptr_);
  CoreML::Specification::FeatureDescription::set_name(pFVar4,&target);
  this_00 = CoreML::Specification::FeatureDescription::mutable_type(pFVar4);
  this_01 = CoreML::Specification::FeatureType::mutable_multiarraytype(this_00);
  this_01->datatype_ = 0x20020;
  CoreML::Specification::ArrayFeatureType::add_shape(this_01,1);
  CoreML::Model::validate((Result *)&feature,&spec);
  CoreML::Result::operator=(&res,(Result *)&feature);
  std::__cxx11::string::~string((string *)&feature._internal_metadata_);
  bVar2 = CoreML::Result::good(&res);
  if (bVar2) {
    poVar7 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                            );
    poVar7 = std::operator<<(poVar7,":");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0x8b1);
    poVar7 = std::operator<<(poVar7,": error: ");
    pcVar10 = "!((res).good())";
  }
  else {
    if (spec.description_ == (ModelDescription *)0x0) {
      spec.description_ =
           (ModelDescription *)&CoreML::Specification::_ModelDescription_default_instance_;
    }
    pRVar1 = ((spec.description_)->input_).super_RepeatedPtrFieldBase.rep_;
    ppvVar12 = pRVar1->elements;
    if (pRVar1 == (Rep *)0x0) {
      ppvVar12 = (void **)0x0;
    }
    iVar9 = ((spec.description_)->input_).super_RepeatedPtrFieldBase.current_size_;
    for (lVar8 = 0; (long)iVar9 * 8 != lVar8; lVar8 = lVar8 + 8) {
      CoreML::Specification::FeatureDescription::FeatureDescription
                (&feature,*(FeatureDescription **)((long)ppvVar12 + lVar8));
      pMVar3 = CoreML::Specification::Model::mutable_description(&spec);
      pFVar4 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                         (&pMVar3->traininginput_);
      CoreML::Specification::FeatureDescription::CopyFrom(pFVar4,&feature);
      CoreML::Specification::FeatureDescription::~FeatureDescription(&feature);
    }
    CoreML::Model::validate((Result *)&feature,&spec);
    CoreML::Result::operator=(&res,(Result *)&feature);
    std::__cxx11::string::~string((string *)&feature._internal_metadata_);
    bVar2 = CoreML::Result::good(&res);
    iVar9 = 0;
    if (bVar2) goto LAB_00167199;
    poVar7 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                            );
    poVar7 = std::operator<<(poVar7,":");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0x8b9);
    poVar7 = std::operator<<(poVar7,": error: ");
    pcVar10 = "(res).good()";
  }
  poVar7 = std::operator<<(poVar7,pcVar10);
  poVar7 = std::operator<<(poVar7," was false, expected true.");
  std::endl<char,std::char_traits<char>>(poVar7);
  iVar9 = 1;
LAB_00167199:
  std::__cxx11::string::~string((string *)&target);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&classLabels);
  lVar8 = 0x60;
  do {
    std::__cxx11::string::~string((string *)((long)&labels[0]._M_dataplus._M_p + lVar8));
    lVar8 = lVar8 + -0x20;
  } while (lVar8 != -0x20);
  std::__cxx11::string::~string((string *)&res.m_message);
  CoreML::Specification::Model::~Model(&spec);
  return iVar9;
}

Assistant:

int testInvalid_Classifier_OnlyTarget() {
    Specification::Model spec;
    Result res;
    TensorAttributes tensorAttributesIn = { "InTensor", 3 };

    std::string labels[] = { "1", "2", "3", "4" };
    std::vector<std::string> classLabels(labels, labels + sizeof(labels) / sizeof(std::string));

    (void)buildBasicNeuralNetworkClassifierModel(spec, true, &tensorAttributesIn, classLabels, std::vector<int64_t>(), true);
    spec.set_specificationversion(MLMODEL_SPECIFICATION_VERSION_IOS13);

    // Clearing and then specifically adding only the predicted feature name as a training input (for the classifier)
    spec.mutable_description()->clear_traininginput();

    auto trainingInput = spec.mutable_description()->mutable_traininginput()->Add();
    std::string target = spec.neuralnetworkclassifier().updateparams().losslayers(0).categoricalcrossentropylosslayer().target();
    trainingInput->set_name(target);
    auto trainingInputTensorShape = trainingInput->mutable_type()->mutable_multiarraytype();
    trainingInputTensorShape->set_datatype(Specification::ArrayFeatureType_ArrayDataType_INT32);
    trainingInputTensorShape->add_shape(1);

    res = Model::validate(spec);
    ML_ASSERT_BAD(res);

    // Add model's inputs to training inputs
    for (auto feature : spec.description().input()) {
        auto trainingInputModel = spec.mutable_description()->mutable_traininginput()->Add();
        trainingInputModel->CopyFrom(feature);
    }
    res = Model::validate(spec);
    ML_ASSERT_GOOD(res);
    return 0;
}